

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall cmGraphVizWriter::OnItem(cmGraphVizWriter *this,cmLinkItem *item)

{
  bool bVar1;
  string *__k;
  mapped_type *this_00;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  bVar1 = ItemExcluded(this,item);
  if (!bVar1) {
    local_50.View_._M_str = (this->GraphNodePrefix)._M_dataplus._M_p;
    local_50.View_._M_len = (this->GraphNodePrefix)._M_string_length;
    cmAlphaNum::cmAlphaNum(&local_80,this->NextNodeId);
    cmStrCat<>(&local_a0,&local_50,&local_80);
    __k = cmLinkItem::AsStr_abi_cxx11_(item);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->NodeNames,__k);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    this->NextNodeId = this->NextNodeId + 1;
    WriteNode(this,&this->GlobalFileStream,item);
  }
  return;
}

Assistant:

void cmGraphVizWriter::OnItem(cmLinkItem const& item)
{
  if (this->ItemExcluded(item)) {
    return;
  }

  this->NodeNames[item.AsStr()] =
    cmStrCat(this->GraphNodePrefix, this->NextNodeId);
  ++this->NextNodeId;

  this->WriteNode(this->GlobalFileStream, item);
}